

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O2

void __thiscall
Assimp::PlyExporter::WriteMeshVertsBinary(PlyExporter *this,aiMesh *m,uint components)

{
  bool bVar1;
  uint n;
  ulong uVar2;
  aiColor4D *paVar3;
  aiVector3D *paVar4;
  uint n_1;
  uint uVar5;
  uint c;
  ulong uVar6;
  undefined1 local_60 [8];
  aiVector3D local_58;
  aiColor4D local_48;
  
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_58.z = 0.0;
  local_60._0_4_ = -1.0;
  local_60._4_4_ = -1.0;
  local_48.r = -1.0;
  local_48.g = -1.0;
  local_48.b = -1.0;
  local_48.a = -1.0;
  for (uVar2 = 0; uVar2 < m->mNumVertices; uVar2 = uVar2 + 1) {
    std::ostream::write((char *)this,(long)(m->mVertices + uVar2));
    if ((components & 1) != 0) {
      paVar4 = m->mNormals + uVar2;
      if (m->mNumVertices == 0) {
        paVar4 = &local_58;
      }
      if (m->mNormals == (aiVector3D *)0x0) {
        paVar4 = &local_58;
      }
      std::ostream::write((char *)this,(long)paVar4);
    }
    uVar5 = 4;
    for (uVar6 = 0; ((uVar5 & components) != 0 && (uVar6 != 8)); uVar6 = uVar6 + 1) {
      paVar4 = (aiVector3D *)local_60;
      if (uVar6 < 8) {
        paVar4 = m->mTextureCoords[uVar6] + uVar2;
        if (m->mNumVertices == 0) {
          paVar4 = (aiVector3D *)local_60;
        }
        if (m->mTextureCoords[uVar6] == (aiVector3D *)0x0) {
          paVar4 = (aiVector3D *)local_60;
        }
      }
      std::ostream::write((char *)this,(long)paVar4);
      uVar5 = uVar5 * 2;
    }
    uVar5 = 0x400;
    for (uVar6 = 0; ((uVar5 & components) != 0 && (uVar6 != 8)); uVar6 = uVar6 + 1) {
      paVar3 = &local_48;
      if (uVar6 < 8) {
        paVar3 = m->mColors[uVar6] + uVar2;
        if (m->mNumVertices == 0) {
          paVar3 = &local_48;
        }
        if (m->mColors[uVar6] == (aiColor4D *)0x0) {
          paVar3 = &local_48;
        }
      }
      std::ostream::write((char *)this,(long)paVar3);
      uVar5 = uVar5 * 2;
    }
    if ((components & 2) != 0) {
      bVar1 = aiMesh::HasTangentsAndBitangents(m);
      if (bVar1) {
        std::ostream::write((char *)this,(long)(m->mTangents + uVar2));
        paVar4 = m->mBitangents + uVar2;
      }
      else {
        paVar4 = &local_58;
        std::ostream::write((char *)this,(long)paVar4);
      }
      std::ostream::write((char *)this,(long)paVar4);
    }
  }
  return;
}

Assistant:

void PlyExporter::WriteMeshVertsBinary(const aiMesh* m, unsigned int components)
{
    // If a component (for instance normal vectors) is present in at least one mesh in the scene,
    // then default values are written for meshes that do not contain this component.
    aiVector3D defaultNormal(0, 0, 0);
    aiVector2D defaultUV(-1, -1);
    aiColor4D defaultColor(-1, -1, -1, -1);
    for (unsigned int i = 0; i < m->mNumVertices; ++i) {
        mOutput.write(reinterpret_cast<const char*>(&m->mVertices[i].x), 12);
        if (components & PLY_EXPORT_HAS_NORMALS) {
            if (m->HasNormals()) {
                mOutput.write(reinterpret_cast<const char*>(&m->mNormals[i].x), 12);
            }
            else {
                mOutput.write(reinterpret_cast<const char*>(&defaultNormal.x), 12);
            }
        }

        for (unsigned int n = PLY_EXPORT_HAS_TEXCOORDS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_TEXTURECOORDS; n <<= 1, ++c) {
            if (m->HasTextureCoords(c)) {
                mOutput.write(reinterpret_cast<const char*>(&m->mTextureCoords[c][i].x), 8);
            }
            else {
                mOutput.write(reinterpret_cast<const char*>(&defaultUV.x), 8);
            }
        }

        for (unsigned int n = PLY_EXPORT_HAS_COLORS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_COLOR_SETS; n <<= 1, ++c) {
            if (m->HasVertexColors(c)) {
                mOutput.write(reinterpret_cast<const char*>(&m->mColors[c][i].r), 16);
            }
            else {
                mOutput.write(reinterpret_cast<const char*>(&defaultColor.r), 16);
            }
        }

        if (components & PLY_EXPORT_HAS_TANGENTS_BITANGENTS) {
            if (m->HasTangentsAndBitangents()) {
                mOutput.write(reinterpret_cast<const char*>(&m->mTangents[i].x), 12);
                mOutput.write(reinterpret_cast<const char*>(&m->mBitangents[i].x), 12);
            }
            else {
                mOutput.write(reinterpret_cast<const char*>(&defaultNormal.x), 12);
                mOutput.write(reinterpret_cast<const char*>(&defaultNormal.x), 12);
            }
        }
    }
}